

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O1

int get_flags(char *bip38,uchar *bytes,size_t bytes_len,size_t *written)

{
  int iVar1;
  uint uVar2;
  size_t serialized_len;
  bip38_layout_t buf;
  size_t local_40;
  undefined1 local_34;
  undefined8 local_33;
  undefined8 uStack_2b;
  undefined8 local_23;
  undefined7 uStack_1b;
  undefined1 uStack_14;
  undefined7 uStack_13;
  
  iVar1 = -2;
  if (written != (size_t *)0x0) {
    *written = 0;
    if (bytes == (uchar *)0x0) {
      iVar1 = wally_base58_to_bytes(bip38,1,(uchar *)&local_33,0x2b,&local_40);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_40 != 0x27) {
        return -2;
      }
    }
    else {
      if (bytes_len != 0x27) {
        return -2;
      }
      uStack_13 = (undefined7)((ulong)*(undefined8 *)(bytes + 0x1f) >> 8);
      local_33 = *(undefined8 *)bytes;
      uStack_2b = *(undefined8 *)(bytes + 8);
      local_23 = *(undefined8 *)(bytes + 0x10);
      uStack_1b = (undefined7)*(undefined8 *)(bytes + 0x18);
      uStack_14 = (undefined1)((ulong)*(undefined8 *)(bytes + 0x18) >> 0x38);
    }
    uVar2 = (uint)(local_33._1_1_ != 'B') * 0x200;
    *written = (ulong)uVar2;
    *written = (ulong)(uVar2 + (local_33._2_1_ & 0x20) * 8);
    wally_clear(&local_34,0x2c);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int get_flags(const char *bip38,
                     const unsigned char *bytes, size_t bytes_len,
                     size_t *written)
{
    struct bip38_layout_t buf;

    if (!written)
        return WALLY_EINVAL;

    *written = 0;

    if (bytes) {
        if (bytes_len != BIP38_SERIALIZED_LEN)
            return WALLY_EINVAL;
        memcpy(&buf.prefix, bytes, BIP38_SERIALIZED_LEN);
    } else {
        size_t serialized_len;
        int ret;
        if ((ret = wally_base58_to_bytes(bip38, BASE58_FLAG_CHECKSUM, &buf.prefix,
                                         BIP38_SERIALIZED_LEN + BASE58_CHECKSUM_LEN,
                                         &serialized_len)))
            return ret;

        if (serialized_len != BIP38_SERIALIZED_LEN)
            return WALLY_EINVAL;
    }

    *written = buf.ec_type != BIP38_NO_ECMUL ? BIP38_KEY_EC_MULT : 0;
    *written |= buf.flags & BIP38_FLAG_COMPRESSED ? BIP38_KEY_COMPRESSED : 0;

    wally_clear(&buf, sizeof(buf));

    return WALLY_OK;
}